

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int smem_remove(char *filename)

{
  int iVar1;
  SHARED_P pvVar2;
  int local_20;
  int r;
  int h;
  int nitems;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local._4_4_ = 0x98;
  }
  else {
    _h = filename;
    r = __isoc99_sscanf(filename,"h%d",&local_20);
    if (r == 1) {
      iVar1 = shared_check_locked_index(local_20);
      if (iVar1 == 0) {
        if (shared_lt[local_20].lkcnt != -1) {
          iVar1 = shared_unlock(local_20);
          if (iVar1 != 0) {
            return iVar1;
          }
          pvVar2 = shared_lock(local_20,1);
          if (pvVar2 == (SHARED_P)0x0) {
            return 0x97;
          }
        }
      }
      else {
        iVar1 = smem_open(_h,1,&local_20);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      shared_set_attr(local_20,4);
      filename_local._4_4_ = smem_close(local_20);
    }
    else {
      filename_local._4_4_ = 0x97;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int     smem_remove(char *filename)
 { int nitems, h, r;

   if (NULL == filename) return(SHARED_NULPTR);
   nitems = sscanf(filename, "h%d", &h);
   if (1 != nitems) return(SHARED_BADARG);

   if (0 == shared_check_locked_index(h))       /* are we locked ? */

     { if (-1 != shared_lt[h].lkcnt)            /* are we locked RO ? */
         { if (SHARED_OK != (r = shared_unlock(h))) return(r);  /* yes, so relock in RW */
           if (NULL == shared_lock(h, SHARED_RDWRITE)) return(SHARED_BADARG);
         }

     }
   else                                         /* not locked */
     { if (SHARED_OK != (r = smem_open(filename, READWRITE, &h)))
         return(r);                             /* so open in RW mode */
     }

   shared_set_attr(h, SHARED_RESIZE);           /* delete PERSIST attribute */
   return(smem_close(h));                       /* detach segment (this will delete it) */
 }